

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O1

int do_setsockopt_set<unsigned_int>
              (void *optval_,size_t optvallen_,
              set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *set_)

{
  int *piVar1;
  
  if (optval_ == (void *)0x0 && optvallen_ == 0) {
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::clear(&set_->_M_t);
  }
  else {
    if (optval_ == (void *)0x0 || optvallen_ != 4) {
      piVar1 = __errno_location();
      *piVar1 = 0x16;
      return -1;
    }
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)set_,(uint *)optval_);
  }
  return 0;
}

Assistant:

static int do_setsockopt_set (const void *const optval_,
                              const size_t optvallen_,
                              std::set<T> *const set_)
{
    if (optvallen_ == 0 && optval_ == NULL) {
        set_->clear ();
        return 0;
    }
    if (optvallen_ == sizeof (T) && optval_ != NULL) {
        set_->insert (*(static_cast<const T *> (optval_)));
        return 0;
    }
    return sockopt_invalid ();
}